

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  u32 N;
  uchar *zIn;
  long in_FS_OFFSET;
  u32 n;
  char *z;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  JsonString jx;
  
  jx._128_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if ((argc & 1U) == 0) {
    jsonInit((JsonString *)&ctx_local,ctx);
    jsonAppendChar((JsonString *)&ctx_local,'{');
    for (z._4_4_ = 0; z._4_4_ < argc; z._4_4_ = z._4_4_ + 2) {
      iVar1 = sqlite3_value_type(argv[z._4_4_]);
      if (iVar1 != 3) {
        sqlite3_result_error(ctx,"json_object() labels must be TEXT",-1);
        jsonReset((JsonString *)&ctx_local);
        goto LAB_001de022;
      }
      jsonAppendSeparator((JsonString *)&ctx_local);
      zIn = sqlite3_value_text(argv[z._4_4_]);
      N = sqlite3_value_bytes(argv[z._4_4_]);
      jsonAppendString((JsonString *)&ctx_local,(char *)zIn,N);
      jsonAppendChar((JsonString *)&ctx_local,':');
      jsonAppendValue((JsonString *)&ctx_local,argv[z._4_4_ + 1]);
    }
    jsonAppendChar((JsonString *)&ctx_local,'}');
    jsonResult((JsonString *)&ctx_local);
    sqlite3_result_subtype(ctx,0x4a);
  }
  else {
    sqlite3_result_error(ctx,"json_object() requires an even number of arguments",-1);
  }
LAB_001de022:
  if (*(long *)(in_FS_OFFSET + 0x28) == jx._128_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}